

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimRel(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wrd_t *vVals)

{
  Vec_Wrd_t *vSimsIn;
  int *piVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int nWordsIn;
  int iVar4;
  Vec_Wrd_t *vRel;
  word *__s;
  Vec_Wrd_t *vSims;
  word *__s_00;
  long lVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  word *pSims;
  int __c;
  word *pwVar10;
  ulong uVar11;
  long lVar12;
  uint nWords;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long local_98;
  ulong uVar13;
  
  vSimsIn = p->vSimsPi;
  nWordsIn = vSimsIn->nSize / p->vCis->nSize;
  iVar4 = vObjs->nSize;
  bVar6 = (byte)iVar4;
  uVar7 = 1 << (bVar6 & 0x1f);
  uVar15 = (ulong)uVar7;
  nWords = nWordsIn << (bVar6 & 0x1f);
  uVar13 = (ulong)nWords;
  vRel = (Vec_Wrd_t *)malloc(0x10);
  uVar14 = nWords;
  if (nWords - 1 < 0xf) {
    uVar14 = 0x10;
  }
  vRel->nSize = 0;
  vRel->nCap = uVar14;
  if (uVar14 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar14 << 3);
  }
  vRel->pArray = __s;
  vRel->nSize = nWords;
  memset(__s,0,(long)(int)nWords * 8);
  iVar8 = p->nObjs * nWordsIn << (bVar6 & 0x1f);
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  vSims->nSize = 0;
  vSims->nCap = iVar9;
  if (iVar9 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)iVar9 << 3);
  }
  vSims->pArray = __s_00;
  vSims->nSize = iVar8;
  memset(__s_00,0,(long)iVar8 << 3);
  Gia_ManSimRelAssignInputs(p,nWords,vSims,nWordsIn,vSimsIn);
  iVar9 = vObjs->nSize;
  if (0 < (long)iVar9) {
    piVar1 = vObjs->pArray;
    if ((int)uVar7 < 2) {
      uVar15 = 1;
    }
    local_98 = 0;
    do {
      if (iVar4 != 0x1f) {
        uVar7 = (piVar1[local_98] << (bVar6 & 0x1f)) * nWordsIn;
        uVar11 = 0;
        uVar14 = uVar7;
        do {
          if ((1 << ((byte)local_98 & 0x1f) & (uint)uVar11) == 0) {
            if (((int)uVar7 < 0) || (iVar8 <= (int)uVar7)) goto LAB_007cb1f4;
            __c = 0;
            uVar3 = uVar7;
          }
          else {
            if (((int)uVar14 < 0) || (iVar8 <= (int)uVar14)) {
LAB_007cb1f4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            __c = 0xff;
            uVar3 = uVar14;
          }
          memset(__s_00 + uVar3,__c,(long)nWordsIn << 3);
          uVar11 = uVar11 + 1;
          uVar14 = uVar14 + nWordsIn;
          uVar7 = uVar7 + nWordsIn;
        } while (uVar15 != uVar11);
      }
      local_98 = local_98 + 1;
    } while (local_98 != iVar9);
  }
  Gia_ManCleanPhase(p);
  if (0 < vObjs->nSize) {
    lVar5 = 0;
    do {
      iVar4 = vObjs->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007cb213;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      *(ulong *)pGVar2 = *(ulong *)pGVar2 | 0x8000000000000000;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vObjs->nSize);
  }
  iVar4 = p->nObjs;
  if ((0 < (long)iVar4) && (pGVar2 = p->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
    lVar5 = 0;
    pwVar10 = __s_00;
    do {
      uVar15 = *(ulong *)(pGVar2 + lVar5);
      if ((uVar15 & 0x8000000080000000) == 0 && (~(uint)uVar15 & 0x1fffffff) != 0) {
        uVar11 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar15 >> 0x1a) & 8));
        uVar14 = (uint)(uVar15 >> 0x20);
        uVar16 = Cnf_CutDeriveTruth::C[uVar14 >> 0x1d & 1];
        uVar7 = (uint)uVar15 & 0x1fffffff;
        uVar14 = uVar14 & 0x1fffffff;
        iVar9 = (int)lVar5;
        if (uVar7 < uVar14) {
          if (0 < (int)nWords) {
            uVar15 = 0;
            do {
              pwVar10[uVar15] =
                   __s_00[(long)(int)((iVar9 - uVar7) * nWords) + uVar15] ^
                   __s_00[(long)(int)((iVar9 - uVar14) * nWords) + uVar15] ^ uVar11 ^ uVar16;
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
        }
        else if (0 < (int)nWords) {
          uVar15 = 0;
          do {
            pwVar10[uVar15] =
                 (__s_00[(long)(int)((iVar9 - uVar14) * nWords) + uVar15] ^ uVar16) &
                 (__s_00[(long)(int)((iVar9 - uVar7) * nWords) + uVar15] ^ uVar11);
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
      }
      lVar5 = lVar5 + 1;
      pwVar10 = pwVar10 + (int)nWords;
    } while (lVar5 != iVar4);
  }
  lVar5 = (long)p->vCos->nSize;
  if (0 < lVar5) {
    piVar1 = p->vCos->pArray;
    lVar12 = 0;
    do {
      iVar9 = piVar1[lVar12];
      if (((long)iVar9 < 0) || (iVar4 <= iVar9)) goto LAB_007cb213;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar15 = *(ulong *)(p->pObjs + iVar9);
      if (-1 < (long)uVar15) {
        if (iVar4 <= iVar9) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (0 < (int)nWords) {
          uVar11 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar15 >> 0x1a) & 8));
          uVar16 = 0;
          do {
            __s_00[(long)(int)(iVar9 * nWords) + uVar16] =
                 __s_00[(long)(int)((iVar9 - ((uint)uVar15 & 0x1fffffff)) * nWords) + uVar16] ^
                 uVar11;
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar5);
  }
  if (0 < vObjs->nSize) {
    lVar5 = 0;
    do {
      iVar4 = vObjs->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_007cb213:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vObjs->nSize);
  }
  iVar4 = Gia_ManSimRelCollectOutputs(p,nWords,vSims,nWordsIn,vVals,vRel);
  if (iVar4 != 0) {
    if (__s != (word *)0x0) {
      free(__s);
      vRel->pArray = (word *)0x0;
    }
    free(vRel);
    vRel = (Vec_Wrd_t *)0x0;
  }
  if (__s_00 != (word *)0x0) {
    free(__s_00);
    vSims->pArray = (word *)0x0;
  }
  free(vSims);
  return vRel;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRel( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wrd_t * vVals )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = 1 << Vec_IntSize(vObjs), i, m, iObj;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vRel  = Vec_WrdStart( nWords * nMints );
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords * nMints );
    Gia_ManSimRelAssignInputs( p, nWords * nMints, vSims, nWords, p->vSimsPi );
    Vec_IntForEachEntry( vObjs, iObj, i )
        for ( m = 0; m < nMints; m++ )
            if ( (m >> i) & 1 )
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0xFF, sizeof(word)*nWords );    
            else
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0x00, sizeof(word)*nWords );    
    Gia_ManCleanPhase( p );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 1;
    Gia_ManForEachAnd( p, pObj, i ) 
        if ( !pObj->fPhase )
            Gia_ManSimPatSimAnd( p, i, pObj, nWords * nMints, vSims );
    Gia_ManForEachCo( p, pObj, i )
        if ( !pObj->fPhase )
            Gia_ManSimPatSimPo( p, Gia_ObjId(p, pObj), pObj, nWords * nMints, vSims );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 0;
    if ( Gia_ManSimRelCollectOutputs( p, nWords * nMints, vSims, nWords, vVals, vRel ) )
        Vec_WrdFreeP( &vRel );
    Vec_WrdFree( vSims );
    return vRel;
}